

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O1

TValue * cpparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  ushort *puVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  lua_State *plVar6;
  int iVar7;
  short sVar8;
  bool bVar9;
  byte bVar10;
  MSize i;
  uint uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  void *pvVar21;
  char *pcVar22;
  size_t sVar23;
  GCstr *pGVar24;
  GCproto *pGVar25;
  GCtab *t;
  TValue *pTVar26;
  void *pvVar27;
  byte bVar28;
  long lVar29;
  uint uVar30;
  uint32_t hbits;
  MSize size;
  double *pdVar31;
  void *__dest;
  int iVar32;
  ErrMsg em;
  byte *pbVar33;
  byte *pbVar34;
  lua_State *plVar35;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  undefined4 *puVar39;
  FuncScope local_320;
  TValue local_310;
  long local_308;
  FuncScope *local_2f8;
  uint8_t local_2d8;
  undefined8 local_2cc;
  undefined8 uStack_2c4;
  byte local_2b8;
  undefined1 local_2b7;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  *(lua_State **)((long)ud + 8) = L;
  *(undefined8 *)ud = 0;
  *(undefined4 *)((long)ud + 0x2c) = 0;
  *(undefined8 *)((long)ud + 0x30) = 0;
  *(undefined8 *)((long)ud + 0x24) = 0x12100000000;
  *(undefined8 *)((long)ud + 0x78) = 0;
  *(undefined8 *)((long)ud + 0x80) = 0;
  *(undefined8 *)((long)ud + 0x84) = 0;
  *(undefined8 *)((long)ud + 0x8c) = 0;
  *(undefined8 *)((long)ud + 0x58) = 0x100000001;
  pvVar21 = lj_mem_realloc(L,*(void **)((long)ud + 0x38),*(MSize *)((long)ud + 0x44),0x20);
  *(void **)((long)ud + 0x38) = pvVar21;
  *(undefined4 *)((long)ud + 0x44) = 0x20;
  piVar2 = (int *)((long)ud + 0x2c);
  iVar32 = *piVar2;
  *piVar2 = *piVar2 + -1;
  if (iVar32 == 0) {
    uVar11 = fillbuf((LexState *)ud);
  }
  else {
    pbVar33 = *(byte **)((long)ud + 0x30);
    *(byte **)((long)ud + 0x30) = pbVar33 + 1;
    uVar11 = (uint)*pbVar33;
  }
  *(uint *)((long)ud + 0x20) = uVar11;
  bVar9 = false;
  if ((((uVar11 == 0xef) && (uVar11 = *(uint *)((long)ud + 0x2c), 1 < uVar11)) &&
      (pcVar22 = *(char **)((long)ud + 0x30), *pcVar22 == -0x45)) &&
     (bVar9 = false, pcVar22[1] == -0x41)) {
    *(char **)((long)ud + 0x30) = pcVar22 + 2;
    *(uint *)((long)ud + 0x2c) = uVar11 - 3;
    if (uVar11 == 2) {
      uVar11 = fillbuf((LexState *)ud);
    }
    else {
      *(char **)((long)ud + 0x30) = pcVar22 + 3;
      uVar11 = (uint)(byte)pcVar22[2];
    }
    *(uint *)((long)ud + 0x20) = uVar11;
    bVar9 = true;
  }
  if (*(int *)((long)ud + 0x20) == 0x23) {
    do {
      piVar2 = (int *)((long)ud + 0x2c);
      iVar32 = *piVar2;
      *piVar2 = *piVar2 + -1;
      if (iVar32 == 0) {
        uVar11 = fillbuf((LexState *)ud);
      }
      else {
        pbVar33 = *(byte **)((long)ud + 0x30);
        *(byte **)((long)ud + 0x30) = pbVar33 + 1;
        uVar11 = (uint)*pbVar33;
      }
      *(uint *)((long)ud + 0x20) = uVar11;
      if (uVar11 == 0xffffffff) goto LAB_00110302;
    } while ((uVar11 != 0xd) && (uVar11 != 10));
    inclinenumber((LexState *)ud);
    bVar9 = true;
  }
  if (*(int *)((long)ud + 0x20) == 0x1b) {
    if (bVar9) {
      pTVar26 = L->top;
      L->top = pTVar26 + 1;
      em = LJ_ERR_BCBAD;
      goto LAB_00110d90;
    }
    iVar32 = 0x62;
    bVar9 = false;
  }
  else {
LAB_00110302:
    bVar9 = true;
    iVar32 = 0x74;
  }
  if ((*(char **)((long)ud + 0x70) != (char *)0x0) &&
     (pcVar22 = strchr(*(char **)((long)ud + 0x70),iVar32), pcVar22 == (char *)0x0)) {
    pTVar26 = L->top;
    L->top = pTVar26 + 1;
    em = LJ_ERR_XMODE;
LAB_00110d90:
    pGVar24 = lj_err_str(L,em);
    (pTVar26->u32).lo = (uint32_t)pGVar24;
    (pTVar26->field_2).it = 0xfffffffb;
    lj_err_throw(L,3);
  }
  if (!bVar9) {
    plVar6 = *(lua_State **)((long)ud + 8);
    *(uint32_t *)((long)ud + 0x5c) = *(int *)&plVar6->top - (plVar6->stack).ptr32;
    *(undefined4 *)((long)ud + 0x40) = 0;
    if (*(uint *)((long)ud + 0x2c) < 0xd) {
      bcread_fill((LexState *)ud,0xd,0);
    }
    iVar32 = *(int *)((long)ud + 0x2c);
    *(int *)((long)ud + 0x2c) = iVar32 + -1;
    pcVar22 = *(char **)((long)ud + 0x30);
    *(char **)((long)ud + 0x30) = pcVar22 + 1;
    if (*pcVar22 == 'L') {
      *(int *)((long)ud + 0x2c) = iVar32 + -2;
      *(char **)((long)ud + 0x30) = pcVar22 + 2;
      if (pcVar22[1] == 'J') {
        *(int *)((long)ud + 0x2c) = iVar32 + -3;
        *(char **)((long)ud + 0x30) = pcVar22 + 3;
        if (pcVar22[2] == '\x01') {
          uVar12 = bcread_uleb128((LexState *)ud);
          *(uint32_t *)((long)ud + 0x94) = uVar12;
          if (uVar12 < 8) {
            if ((3 < uVar12) &&
               (plVar35 = *(lua_State **)((long)ud + 8),
               *(int *)((ulong)(plVar35->glref).ptr32 + 0xfc) == 0)) {
              pTVar26 = plVar35->top;
              uVar11 = (plVar35->stack).ptr32;
              luaopen_ffi(plVar35);
              plVar35->top = (TValue *)
                             ((long)pTVar26 + ((ulong)(plVar35->stack).ptr32 - (ulong)uVar11));
            }
            if ((uVar12 & 2) == 0) {
              uVar12 = bcread_uleb128((LexState *)ud);
              if (*(uint *)((long)ud + 0x2c) < uVar12) {
                bcread_fill((LexState *)ud,uVar12,1);
              }
              plVar35 = *(lua_State **)((long)ud + 8);
              pcVar22 = *(char **)((long)ud + 0x30);
              *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar12;
              sVar23 = (size_t)uVar12;
              *(char **)((long)ud + 0x30) = pcVar22 + sVar23;
            }
            else {
              plVar35 = *(lua_State **)((long)ud + 8);
              pcVar22 = *(char **)((long)ud + 0x68);
              sVar23 = strlen(pcVar22);
            }
            pGVar24 = lj_str_new(plVar35,pcVar22,sVar23);
            *(GCstr **)((long)ud + 0x60) = pGVar24;
            do {
              uVar11 = *(uint *)((long)ud + 0x2c);
              if ((uVar11 == 0) || (**(char **)((long)ud + 0x30) != '\0')) {
                if (uVar11 < 5) {
                  bcread_fill((LexState *)ud,5,0);
                }
                uVar12 = bcread_uleb128((LexState *)ud);
                if (uVar12 == 0) goto LAB_00110b50;
                if (*(uint *)((long)ud + 0x2c) < uVar12) {
                  bcread_fill((LexState *)ud,uVar12,1);
                }
                iVar32 = *(int *)((long)ud + 0x2c);
                *(int *)((long)ud + 0x2c) = iVar32 + -1;
                pbVar33 = *(byte **)((long)ud + 0x30);
                *(byte **)((long)ud + 0x30) = pbVar33 + 1;
                bVar10 = *pbVar33;
                *(int *)((long)ud + 0x2c) = iVar32 + -2;
                *(byte **)((long)ud + 0x30) = pbVar33 + 2;
                bVar28 = pbVar33[1];
                *(int *)((long)ud + 0x2c) = iVar32 + -3;
                *(byte **)((long)ud + 0x30) = pbVar33 + 3;
                bVar3 = pbVar33[2];
                *(int *)((long)ud + 0x2c) = iVar32 + -4;
                *(byte **)((long)ud + 0x30) = pbVar33 + 4;
                bVar4 = pbVar33[3];
                uVar13 = bcread_uleb128((LexState *)ud);
                uVar14 = bcread_uleb128((LexState *)ud);
                uVar15 = bcread_uleb128((LexState *)ud);
                uVar18 = 0;
                if ((*(byte *)((long)ud + 0x94) & 2) == 0) {
                  uVar16 = bcread_uleb128((LexState *)ud);
                  uVar17 = 0;
                  sVar23 = 0;
                  uVar18 = 0;
                  if (uVar16 != 0) {
                    uVar17 = bcread_uleb128((LexState *)ud);
                    uVar18 = bcread_uleb128((LexState *)ud);
                    sVar23 = (size_t)uVar16;
                  }
                }
                else {
                  uVar17 = 0;
                  sVar23 = 0;
                }
                uVar30 = uVar15 + 1;
                uVar36 = (uVar13 + uVar30) * 4 + 0x47 & 0xfffffff8;
                iVar38 = uVar36 + uVar14 * 8;
                uVar11 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + iVar38;
                iVar7 = (int)sVar23;
                size = iVar7 + uVar11;
                pvVar27 = lj_mem_newgco(*(lua_State **)((long)ud + 8),size);
                *(undefined1 *)((long)pvVar27 + 5) = 7;
                *(byte *)((long)pvVar27 + 6) = bVar28;
                *(byte *)((long)pvVar27 + 7) = bVar3;
                *(uint *)((long)pvVar27 + 8) = uVar30;
                lVar29 = (ulong)uVar36 + (long)pvVar27;
                *(int *)((long)pvVar27 + 0x10) = (int)lVar29;
                *(int *)((long)pvVar27 + 0x14) = iVar38 + (int)pvVar27;
                *(undefined4 *)((long)pvVar27 + 0x18) = 0;
                *(uint32_t *)((long)pvVar27 + 0x1c) = uVar14;
                *(MSize *)((long)pvVar27 + 0x20) = size;
                *(byte *)((long)pvVar27 + 0x24) = bVar4;
                *(byte *)((long)pvVar27 + 0x25) = bVar10;
                *(undefined2 *)((long)pvVar27 + 0x26) = 0;
                *(undefined4 *)((long)pvVar27 + 0x28) = *(undefined4 *)((long)ud + 0x60);
                *(undefined4 *)(lVar29 + (ulong)(uVar13 + 1) * -4) = 0;
                bVar10 = (bVar10 & 2) >> 1;
                *(uint *)((long)pvVar27 + 0x40) =
                     (uint)bVar10 + (uint)bVar10 * 2 + (uint)bVar3 * 0x100 + 0x55;
                uVar36 = uVar30 * 4 - 4;
                pvVar21 = *(void **)((long)ud + 0x30);
                *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar36;
                *(ulong *)((long)ud + 0x30) = (long)pvVar21 + (ulong)uVar36;
                memcpy((void *)((long)pvVar27 + 0x44),pvVar21,(ulong)uVar36);
                if ((1 < uVar30) && ((*(uint *)((long)ud + 0x94) & 1) != 0)) {
                  lVar29 = 0;
                  do {
                    uVar36 = *(uint *)((long)pvVar27 + lVar29 * 4 + 0x44);
                    *(uint *)((long)pvVar27 + lVar29 * 4 + 0x44) =
                         uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                         uVar36 << 0x18;
                    lVar29 = lVar29 + 1;
                  } while ((ulong)uVar30 - 1 != lVar29);
                }
                if (bVar4 != 0) {
                  uVar36 = (uint)bVar4 + (uint)bVar4;
                  uVar30 = *(uint *)((long)pvVar27 + 0x14);
                  pvVar21 = *(void **)((long)ud + 0x30);
                  *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar36;
                  *(ulong *)((long)ud + 0x30) = (long)pvVar21 + (ulong)uVar36;
                  memcpy((void *)(ulong)uVar30,pvVar21,(ulong)uVar36);
                  if ((*(byte *)((long)ud + 0x94) & 1) != 0) {
                    uVar37 = 0;
                    do {
                      puVar1 = (ushort *)((long)(ulong)uVar30 + uVar37 * 2);
                      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                      uVar37 = uVar37 + 1;
                    } while (bVar4 != uVar37);
                  }
                }
                if (uVar13 != 0) {
                  puVar39 = (undefined4 *)
                            ((ulong)*(uint *)((long)pvVar27 + 0x10) + (ulong)uVar13 * -4);
                  uVar16 = 0;
                  do {
                    uVar19 = bcread_uleb128((LexState *)ud);
                    if (uVar19 < 5) {
                      if (uVar19 == 0) {
                        lVar29 = *(long *)((long)ud + 8);
                        uVar37 = *(ulong *)(lVar29 + 0x18);
                        if (uVar37 <= (long)*(int *)((long)ud + 0x5c) +
                                      (ulong)*(uint *)(lVar29 + 0x24)) goto LAB_00110d3f;
                        *(ulong *)(lVar29 + 0x18) = uVar37 - 8;
                        *puVar39 = *(undefined4 *)(uVar37 - 8);
                      }
                      else if (uVar19 == 1) {
                        uVar20 = bcread_uleb128((LexState *)ud);
                        uVar19 = bcread_uleb128((LexState *)ud);
                        if (uVar19 == 0) {
                          hbits = 0;
                        }
                        else {
                          hbits = 1;
                          if (uVar19 != 1) {
                            uVar30 = 0x1f;
                            if (uVar19 - 1 != 0) {
                              for (; uVar19 - 1 >> uVar30 == 0; uVar30 = uVar30 - 1) {
                              }
                            }
                            hbits = (uVar30 ^ 0xffffffe0) + 0x21;
                          }
                        }
                        t = lj_tab_new(*(lua_State **)((long)ud + 8),uVar20,hbits);
                        if (uVar20 != 0) {
                          pTVar26 = (TValue *)(ulong)(t->array).ptr32;
                          do {
                            bcread_ktabk((LexState *)ud,pTVar26);
                            pTVar26 = pTVar26 + 1;
                            uVar20 = uVar20 - 1;
                          } while (uVar20 != 0);
                        }
                        for (; uVar19 != 0; uVar19 = uVar19 - 1) {
                          bcread_ktabk((LexState *)ud,&local_310);
                          pTVar26 = lj_tab_set(*(lua_State **)((long)ud + 8),t,&local_310);
                          bcread_ktabk((LexState *)ud,pTVar26);
                        }
                        *puVar39 = (int)t;
                      }
                      else {
                        sVar8 = (uVar19 != 2) + 0xb;
                        if (uVar19 == 4) {
                          sVar8 = 0x10;
                        }
                        pvVar21 = lj_mem_newgco(*(lua_State **)((long)ud + 8),
                                                (uint)(uVar19 == 4) * 8 + 0x10);
                        *(undefined1 *)((long)pvVar21 + 5) = 10;
                        *(short *)((long)pvVar21 + 6) = sVar8;
                        *puVar39 = (int)pvVar21;
                        uVar20 = bcread_uleb128((LexState *)ud);
                        *(uint32_t *)((long)pvVar21 + 8) = uVar20;
                        uVar20 = bcread_uleb128((LexState *)ud);
                        *(uint32_t *)((long)pvVar21 + 0xc) = uVar20;
                        if (uVar19 == 4) {
                          uVar19 = bcread_uleb128((LexState *)ud);
                          *(uint32_t *)((long)pvVar21 + 0x10) = uVar19;
                          uVar19 = bcread_uleb128((LexState *)ud);
                          *(uint32_t *)((long)pvVar21 + 0x14) = uVar19;
                        }
                      }
                    }
                    else {
                      uVar30 = uVar19 - 5;
                      pcVar22 = *(char **)((long)ud + 0x30);
                      *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - uVar30;
                      *(char **)((long)ud + 0x30) = pcVar22 + uVar30;
                      pGVar24 = lj_str_new(*(lua_State **)((long)ud + 8),pcVar22,(ulong)uVar30);
                      *puVar39 = (int)pGVar24;
                    }
                    uVar16 = uVar16 + 1;
                    puVar39 = puVar39 + 1;
                  } while (uVar16 != uVar13);
                }
                *(uint32_t *)((long)pvVar27 + 0x18) = uVar13;
                if (uVar14 != 0) {
                  pdVar31 = (double *)(ulong)*(uint *)((long)pvVar27 + 0x10);
                  uVar13 = 0;
                  do {
                    bVar10 = **(byte **)((long)ud + 0x30);
                    pbVar33 = *(byte **)((long)ud + 0x30) + 1;
                    uVar30 = (uint)(bVar10 >> 1);
                    if ((char)bVar10 < '\0') {
                      uVar30 = uVar30 & 0x3f;
                      iVar38 = *(int *)((long)ud + 0x2c);
                      bVar28 = 6;
                      pbVar34 = pbVar33;
                      do {
                        iVar38 = iVar38 + -1;
                        uVar30 = uVar30 | (*pbVar34 & 0x7f) << (bVar28 & 0x1f);
                        *(int *)((long)ud + 0x2c) = iVar38;
                        pbVar33 = pbVar34 + 1;
                        bVar28 = bVar28 + 7;
                        bVar3 = *pbVar34;
                        pbVar34 = pbVar33;
                      } while ((char)bVar3 < '\0');
                    }
                    *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) + -1;
                    *(byte **)((long)ud + 0x30) = pbVar33;
                    if ((bVar10 & 1) == 0) {
                      *pdVar31 = (double)(int)uVar30;
                    }
                    else {
                      *(uint *)pdVar31 = uVar30;
                      uVar16 = bcread_uleb128((LexState *)ud);
                      *(uint32_t *)((long)pdVar31 + 4) = uVar16;
                    }
                    uVar13 = uVar13 + 1;
                    pdVar31 = pdVar31 + 1;
                  } while (uVar13 != uVar14);
                }
                *(uint32_t *)((long)pvVar27 + 0x2c) = uVar17;
                *(uint32_t *)((long)pvVar27 + 0x30) = uVar18;
                if (iVar7 == 0) {
                  *(undefined8 *)((long)pvVar27 + 0x34) = 0;
                  uVar11 = 0;
                }
                else {
                  bVar10 = 2 - ((int)uVar18 < 0x10000);
                  if ((int)uVar18 < 0x100) {
                    bVar10 = 0;
                  }
                  uVar37 = (long)pvVar27 + (ulong)uVar11;
                  iVar38 = (int)uVar37;
                  *(int *)((long)pvVar27 + 0x34) = iVar38;
                  *(uint32_t *)((long)pvVar27 + 0x38) = (uVar15 << (bVar10 & 0x1f)) + iVar38;
                  pvVar21 = *(void **)((long)ud + 0x30);
                  *(int *)((long)ud + 0x2c) = *(int *)((long)ud + 0x2c) - iVar7;
                  __dest = (void *)(uVar37 & 0xffffffff);
                  *(size_t *)((long)ud + 0x30) = (long)pvVar21 + sVar23;
                  memcpy(__dest,pvVar21,sVar23);
                  if (((*(byte *)((long)ud + 0x94) & 1) != 0) &&
                     (0xff < *(int *)((long)pvVar27 + 0x30))) {
                    uVar11 = *(int *)((long)pvVar27 + 8) - 1;
                    if (*(int *)((long)pvVar27 + 0x30) < 0x10000) {
                      if (uVar11 != 0) {
                        uVar37 = 0;
                        do {
                          puVar1 = (ushort *)((long)__dest + uVar37 * 2);
                          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                          uVar37 = uVar37 + 1;
                        } while (uVar11 != uVar37);
                      }
                    }
                    else if (uVar11 != 0) {
                      uVar37 = 0;
                      do {
                        uVar30 = *(uint *)((long)__dest + uVar37 * 4);
                        *(uint *)((long)__dest + uVar37 * 4) =
                             uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 |
                             uVar30 << 0x18;
                        uVar37 = uVar37 + 1;
                      } while (uVar11 != uVar37);
                    }
                  }
                  uVar11 = *(uint *)((long)pvVar27 + 0x38);
                  pcVar22 = (char *)(ulong)uVar11;
                  uVar30 = (uint)*(byte *)((long)pvVar27 + 0x24);
                  if (*(byte *)((long)pvVar27 + 0x24) != 0) {
                    do {
                      uVar37 = (ulong)pcVar22 & 0xffffffff;
                      do {
                        uVar11 = (int)uVar37 + 1;
                        uVar37 = (ulong)uVar11;
                        cVar5 = *pcVar22;
                        pcVar22 = pcVar22 + 1;
                      } while (cVar5 != '\0');
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                }
                *(uint *)((long)pvVar27 + 0x3c) = uVar11;
                if (uVar12 != iVar32 - *(int *)((long)ud + 0x2c)) goto LAB_00110d3f;
              }
              else {
                *(uint *)((long)ud + 0x2c) = uVar11 - 1;
                *(char **)((long)ud + 0x30) = *(char **)((long)ud + 0x30) + 1;
LAB_00110b50:
                pvVar27 = (void *)0x0;
              }
              if (pvVar27 == (void *)0x0) goto LAB_00110c27;
              pTVar26 = plVar6->top;
              (pTVar26->u32).lo = (uint32_t)pvVar27;
              (pTVar26->field_2).it = 0xfffffff8;
              pTVar26 = plVar6->top;
              plVar6->top = pTVar26 + 1;
              if ((TValue *)(ulong)(plVar6->maxstack).ptr32 <= pTVar26 + 1) {
                lj_state_growstack(plVar6,1);
              }
            } while( true );
          }
        }
      }
    }
    bcread_error((LexState *)ud,LJ_ERR_BCFMT);
  }
  plVar6 = *(lua_State **)((long)ud + 8);
  pcVar22 = *(char **)((long)ud + 0x68);
  sVar23 = strlen(pcVar22);
  pGVar24 = lj_str_new(plVar6,pcVar22,sVar23);
  *(GCstr **)((long)ud + 0x60) = pGVar24;
  pTVar26 = plVar6->top;
  (pTVar26->u32).lo = (uint32_t)pGVar24;
  (pTVar26->field_2).it = 0xfffffffb;
  pTVar26 = plVar6->top;
  plVar6->top = pTVar26 + 1;
  if ((TValue *)(ulong)(plVar6->maxstack).ptr32 <= pTVar26 + 1) {
    lj_state_growstack(plVar6,1);
  }
  *(undefined4 *)((long)ud + 0x94) = 0;
  fs_init((LexState *)ud,(FuncState *)&local_310.field_2);
  local_2b7 = 0;
  local_2cc = 0;
  uStack_2c4 = 0;
  local_2b8 = local_2b8 | 2;
  local_320.nactvar = local_2d8;
  local_320.flags = '\0';
  local_320.vstart = *(MSize *)(local_308 + 0x84);
  local_320.prev = local_2f8;
  local_2f8 = &local_320;
  bcemit_INS((FuncState *)&local_310.field_2,0x58);
  lj_lex_next((LexState *)ud);
  parse_chunk((LexState *)ud);
  if (*(int *)((long)ud + 0x24) != 0x121) {
    err_token((LexState *)ud,0x121);
  }
  pGVar25 = fs_finish((LexState *)ud,*(BCLine *)((long)ud + 0x58));
  plVar6->top = plVar6->top + -1;
  goto LAB_00110c56;
LAB_00110c27:
  if ((0 < *(int *)((long)ud + 0x2c)) ||
     (pTVar26 = plVar6->top + -1,
     pTVar26 != (TValue *)((long)*(int *)((long)ud + 0x5c) + (ulong)(plVar6->stack).ptr32))) {
LAB_00110d3f:
    bcread_error((LexState *)ud,LJ_ERR_BCBAD);
  }
  plVar6->top = pTVar26;
  pGVar25 = (GCproto *)(ulong)(pTVar26->u32).lo;
LAB_00110c56:
  uVar12 = (L->env).gcptr32;
  pvVar21 = lj_mem_newgco(L,(uint)pGVar25->sizeuv * 4 + 0x14);
  *(undefined2 *)((long)pvVar21 + 5) = 8;
  *(undefined1 *)((long)pvVar21 + 7) = 0;
  *(uint *)((long)pvVar21 + 0x10) = (uint)pGVar25 + 0x40;
  *(uint32_t *)((long)pvVar21 + 8) = uVar12;
  pGVar25->flags = (pGVar25->flags - ((byte)(pGVar25->flags + 0x20 >> 3) & 0xe0)) + ' ';
  bVar10 = pGVar25->sizeuv;
  if ((ulong)bVar10 != 0) {
    uVar37 = 0;
    do {
      pvVar27 = lj_mem_newgco(L,0x18);
      *(undefined2 *)((long)pvVar27 + 5) = 0x105;
      *(undefined4 *)((long)pvVar27 + 0xc) = 0xffffffff;
      *(int *)((long)pvVar27 + 0x10) = (int)pvVar27 + 8;
      *(uint *)((long)pvVar27 + 0x14) =
           (uint)*(ushort *)((ulong)(pGVar25->uv).ptr32 + uVar37 * 2) << 0x18 ^ (uint)pGVar25;
      *(int *)((long)pvVar21 + uVar37 * 4 + 0x14) = (int)pvVar27;
      uVar37 = uVar37 + 1;
    } while (bVar10 != uVar37);
  }
  *(byte *)((long)pvVar21 + 7) = bVar10;
  pTVar26 = L->top;
  L->top = pTVar26 + 1;
  (pTVar26->u32).lo = (uint32_t)pvVar21;
  (pTVar26->field_2).it = 0xfffffff7;
  return (TValue *)0x0;
}

Assistant:

static TValue *cpparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  LexState *ls = (LexState *)ud;
  GCproto *pt;
  GCfunc *fn;
  int bc;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  bc = lj_lex_setup(L, ls);
  if (ls->mode && !strchr(ls->mode, bc ? 'b' : 't')) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_XMODE));
    lj_err_throw(L, LUA_ERRSYNTAX);
  }
  pt = bc ? lj_bcread(ls) : lj_parse(ls);
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* Don't combine above/below into one statement. */
  setfuncV(L, L->top++, fn);
  return NULL;
}